

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t archive_string_append_from_wcs(archive_string *as,wchar_t *w,size_t len)

{
  size_t sVar1;
  archive_string *paVar2;
  size_t sVar3;
  ulong uVar4;
  int *piVar5;
  wchar_t __wc;
  char *__s;
  char *pcVar6;
  size_t sVar7;
  wchar_t local_4c;
  ulong local_40;
  mbstate_t_conflict shift_state;
  
  shift_state.__count = L'\0';
  shift_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  paVar2 = archive_string_ensure(as,len + as->length + 1);
  if (paVar2 == (archive_string *)0x0) {
    local_4c = L'\xffffffff';
  }
  else {
    pcVar6 = as->s;
    __s = pcVar6 + as->length;
    sVar7 = as->buffer_length;
    sVar3 = __ctype_get_mb_cur_max();
    pcVar6 = pcVar6 + ~sVar3 + sVar7;
    local_40 = len * 2;
    local_4c = L'\0';
    for (sVar7 = 0; (__wc = w[sVar7], __wc != L'\0' && (len != sVar7)); sVar7 = sVar7 + 1) {
      if (pcVar6 <= __s) {
        as->length = (long)__s - (long)as->s;
        *__s = '\0';
        sVar1 = as->length;
        sVar3 = __ctype_get_mb_cur_max();
        uVar4 = local_40;
        if (local_40 <= sVar3) {
          uVar4 = __ctype_get_mb_cur_max();
        }
        paVar2 = archive_string_ensure(as,sVar1 + uVar4 + 1);
        if (paVar2 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        pcVar6 = as->s;
        __s = pcVar6 + as->length;
        sVar1 = as->buffer_length;
        sVar3 = __ctype_get_mb_cur_max();
        pcVar6 = pcVar6 + ~sVar3 + sVar1;
        __wc = w[sVar7];
      }
      sVar3 = wcrtomb(__s,__wc,(mbstate_t *)&shift_state);
      if ((int)sVar3 == -1) {
        piVar5 = __errno_location();
        local_4c = L'\xffffffff';
        if (*piVar5 != 0x54) break;
        *__s = '?';
        __s = __s + 1;
      }
      else {
        __s = __s + (int)sVar3;
      }
      local_40 = local_40 - 2;
    }
    as->length = (long)__s - (long)as->s;
    *__s = '\0';
  }
  return local_4c;
}

Assistant:

int
archive_string_append_from_wcs(struct archive_string *as,
    const wchar_t *w, size_t len)
{
	/* We cannot use the standard wcstombs() here because it
	 * cannot tell us how big the output buffer should be.  So
	 * I've built a loop around wcrtomb() or wctomb() that
	 * converts a character at a time and resizes the string as
	 * needed.  We prefer wcrtomb() when it's available because
	 * it's thread-safe. */
	int n, ret_val = 0;
	char *p;
	char *end;
#if HAVE_WCRTOMB
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#else
	/* Clear the shift state before starting. */
	wctomb(NULL, L'\0');
#endif
	/*
	 * Allocate buffer for MBS.
	 * We need this allocation here since it is possible that
	 * as->s is still NULL.
	 */
	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	p = as->s + as->length;
	end = as->s + as->buffer_length - MB_CUR_MAX -1;
	while (*w != L'\0' && len > 0) {
		if (p >= end) {
			as->length = p - as->s;
			as->s[as->length] = '\0';
			/* Re-allocate buffer for MBS. */
			if (archive_string_ensure(as,
			    as->length + max(len * 2,
			    (size_t)MB_CUR_MAX) + 1) == NULL)
				return (-1);
			p = as->s + as->length;
			end = as->s + as->buffer_length - MB_CUR_MAX -1;
		}
#if HAVE_WCRTOMB
		n = wcrtomb(p, *w++, &shift_state);
#else
		n = wctomb(p, *w++);
#endif
		if (n == -1) {
			if (errno == EILSEQ) {
				/* Skip an illegal wide char. */
				*p++ = '?';
				ret_val = -1;
			} else {
				ret_val = -1;
				break;
			}
		} else
			p += n;
		len--;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (ret_val);
}